

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
::dx(FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
     *this,int i)

{
  double *pdVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
  *in_RDI;
  value_type vVar2;
  value_type vVar3;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd8;
  Fad<double> *in_stack_ffffffffffffffe0;
  double dVar4;
  
  pdVar1 = Fad<double>::dx(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                          );
  dVar4 = *pdVar1;
  vVar2 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
          ::val((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                 *)0x157e98e);
  vVar3 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
          ::dx(in_RDI,in_stack_ffffffffffffffcc);
  pdVar1 = Fad<double>::val((Fad<double> *)(in_RDI->fadexpr_).left_);
  return dVar4 * vVar2 + vVar3 * *pdVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}